

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O0

void __thiscall DTreePropagator::explain_cycle(DTreePropagator *this,int u,int v,vec<Lit> *pathe)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  Lit *in_RCX;
  long *in_RDI;
  int de;
  uint k;
  vector<int,_std::allocator<int>_> pathn;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  Lit in_stack_ffffffffffffff54;
  Lit *elem;
  BoolView *in_stack_ffffffffffffff60;
  uint local_34;
  vector<int,_std::allocator<int>_> local_30;
  Lit *local_18;
  
  local_18 = in_RCX;
  RerootedUnionFind<Tint>::connectionsFromTo
            ((RerootedUnionFind<Tint> *)
             pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,
             pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish._4_4_,
             (int)pathn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  local_34 = 0;
  do {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_30);
    if (sVar4 - 1 <= (ulong)local_34) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60);
      return;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_34);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)(local_34 + 1));
    iVar3 = (**(code **)(*in_RDI + 0xb8))(in_RDI,vVar1,*pvVar5);
    if (iVar3 == -1) {
LAB_002046b9:
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)(local_34 + 1));
      vVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)local_34);
      (**(code **)(*in_RDI + 0xb8))(in_RDI,vVar1,*pvVar5);
    }
    else {
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      bVar2 = BoolView::isFixed((BoolView *)0x204677);
      if (!bVar2) goto LAB_002046b9;
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      bVar2 = BoolView::isFalse((BoolView *)
                                CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50));
      if (bVar2) goto LAB_002046b9;
    }
    elem = local_18;
    in_stack_ffffffffffffff60 =
         GraphPropagator::getEdgeVar
                   ((GraphPropagator *)
                    CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    in_stack_ffffffffffffff54 =
         BoolView::getValLit((BoolView *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    vec<Lit>::push((vec<Lit> *)in_stack_ffffffffffffff60,elem);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void DTreePropagator::explain_cycle(int u, int v, vec<Lit>& pathe) {
	assert(u != v);
	std::vector<int> pathn = ruf.connectionsFromTo(u, v);
	assert(!pathn.empty());
	for (unsigned int k = 0; k < pathn.size() - 1; k++) {
		int de = findEdge(pathn[k], pathn[k + 1]);
		if (de == -1 || !getEdgeVar(de).isFixed() || getEdgeVar(de).isFalse()) {
			de = findEdge(pathn[k + 1], pathn[k]);
		}
		assert(de != -1);
		assert(getEdgeVar(de).isFixed());
		assert(getEdgeVar(de).isTrue());
		pathe.push(getEdgeVar(de).getValLit());
	}
}